

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decReverse(uint8_t *ulo,uint8_t *uhi)

{
  uint8_t uVar1;
  
  for (; ulo < uhi; ulo = ulo + 1) {
    uVar1 = *ulo;
    *ulo = *uhi;
    *uhi = uVar1;
    uhi = uhi + -1;
  }
  return;
}

Assistant:

static void decReverse(Unit *ulo, Unit *uhi) {
  Unit temp;
  for (; ulo<uhi; ulo++, uhi--) {
    temp=*ulo;
    *ulo=*uhi;
    *uhi=temp;
    }
  return;
  }